

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::Bool(Builder *this,bool b)

{
  Value local_28;
  undefined1 local_11;
  Builder *pBStack_10;
  bool b_local;
  Builder *this_local;
  
  local_11 = b;
  pBStack_10 = this;
  Value::Value(&local_28,b);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::push_back
            (&this->stack_,&local_28);
  return;
}

Assistant:

void Bool(bool b) { stack_.push_back(Value(b)); }